

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::to_combined_image_sampler_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,VariableID image_id,VariableID samp_id)

{
  anon_class_8_2_24d8d211_for__M_pred __pred;
  anon_class_12_4_88f6dcbb_for__M_pred __pred_00;
  uint32_t uVar1;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *__cont;
  SPIRVariable *pSVar2;
  SPIRVariable *pSVar3;
  Parameter *pPVar4;
  Parameter *pPVar5;
  Parameter *pPVar6;
  CombinedImageSamplerParameter *pCVar7;
  CombinedImageSamplerParameter *pCVar8;
  CompilerError *pCVar9;
  CombinedImageSampler *pCVar10;
  CombinedImageSampler *pCVar11;
  string local_170;
  uint32_t local_150;
  uint32_t uStack_14c;
  CombinedImageSampler *local_148;
  CombinedImageSampler *itr_1;
  SmallVector<spirv_cross::CombinedImageSampler,_8UL> *mapping;
  string local_130;
  ulong local_110;
  uint32_t local_108;
  byte local_fc;
  byte bStack_fb;
  undefined2 uStack_fa;
  uint32_t uStack_f8;
  uint32_t local_f4;
  CombinedImageSamplerParameter *local_f0;
  CombinedImageSamplerParameter *itr;
  SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL> *combined;
  VariableID sid;
  VariableID iid;
  bool global_sampler;
  bool global_image;
  Parameter *sampler_itr;
  Parameter *image_itr;
  SPIRVariable *samp;
  SPIRVariable *image;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *args;
  string local_88 [32];
  long local_68;
  size_type array_index;
  string array_expr;
  string image_expr;
  CompilerGLSL *this_local;
  VariableID samp_id_local;
  VariableID image_id_local;
  
  this_local._0_4_ = samp_id.id;
  this_local._4_4_ = image_id.id;
  _samp_id_local = __return_storage_ptr__;
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  to_non_uniform_aware_expression_abi_cxx11_((string *)((long)&array_expr.field_2 + 8),this,uVar1);
  ::std::__cxx11::string::string((string *)&array_index);
  local_68 = ::std::__cxx11::string::find_first_of((char)&array_expr + '\x18',0x5b);
  if (local_68 != -1) {
    ::std::__cxx11::string::substr((ulong)local_88,(ulong)((long)&array_expr.field_2 + 8));
    ::std::__cxx11::string::operator=((string *)&array_index,local_88);
    ::std::__cxx11::string::~string(local_88);
  }
  __cont = &((this->super_Compiler).current_function)->arguments;
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  pSVar2 = Compiler::maybe_get_backing_variable(&this->super_Compiler,uVar1);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this_local);
  pSVar3 = Compiler::maybe_get_backing_variable(&this->super_Compiler,uVar1);
  if (pSVar2 != (SPIRVariable *)0x0) {
    this_local._4_4_ =
         (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&(pSVar2->super_IVariant).self);
  }
  if (pSVar3 != (SPIRVariable *)0x0) {
    this_local._0_4_ =
         (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&(pSVar3->super_IVariant).self);
  }
  pPVar4 = ::std::begin<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>(__cont);
  pPVar5 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>(__cont);
  pPVar4 = ::std::
           find_if<spirv_cross::SPIRFunction::Parameter*,spirv_cross::CompilerGLSL::to_combined_image_sampler[abi:cxx11](spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>)::__0>
                     (pPVar4,pPVar5,(anon_class_4_1_b4afabfd_for__M_pred)this_local._4_4_);
  pPVar5 = ::std::begin<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>(__cont);
  pPVar6 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>(__cont);
  pPVar5 = ::std::
           find_if<spirv_cross::SPIRFunction::Parameter*,spirv_cross::CompilerGLSL::to_combined_image_sampler[abi:cxx11](spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>)::__1>
                     (pPVar5,pPVar6,(anon_class_4_1_f2814289_for__M_pred)this_local._0_4_);
  pPVar6 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>(__cont);
  if (pPVar4 == pPVar6) {
    pPVar6 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>(__cont);
    if (pPVar5 == pPVar6) {
      itr_1 = (CombinedImageSampler *)&(this->super_Compiler).combined_image_samplers;
      pCVar10 = ::std::begin<spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,8ul>>
                          ((SmallVector<spirv_cross::CombinedImageSampler,_8UL> *)itr_1);
      pCVar11 = ::std::end<spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,8ul>>
                          ((SmallVector<spirv_cross::CombinedImageSampler,_8UL> *)itr_1);
      local_150 = this_local._4_4_;
      uStack_14c = this_local._0_4_;
      __pred.samp_id.id = this_local._0_4_;
      __pred.image_id.id = this_local._4_4_;
      pCVar10 = ::std::
                find_if<spirv_cross::CombinedImageSampler*,spirv_cross::CompilerGLSL::to_combined_image_sampler[abi:cxx11](spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>)::__3>
                          (pCVar10,pCVar11,__pred);
      local_148 = pCVar10;
      pCVar11 = ::std::end<spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,8ul>>
                          (&(this->super_Compiler).combined_image_samplers);
      if (pCVar10 == pCVar11) {
        pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar9,
                   "Cannot find mapping for combined sampler, was build_combined_image_samplers() used before compile() was called?"
                  );
        __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)local_148);
      to_expression_abi_cxx11_(&local_170,this,uVar1,true);
      ::std::operator+(__return_storage_ptr__,&local_170,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &array_index);
      ::std::__cxx11::string::~string((string *)&local_170);
      goto LAB_00487c32;
    }
  }
  pPVar6 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>(__cont);
  sid.id._3_1_ = pPVar4 == pPVar6;
  pPVar6 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>(__cont);
  sid.id._2_1_ = pPVar5 == pPVar6;
  if ((sid.id._3_1_ & 1) == 0) {
    pPVar6 = ::std::begin<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>
                       (__cont);
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)((long)&combined + 4),
               (int)((ulong)((long)pPVar4 - (long)pPVar6) >> 2) * -0x33333333);
  }
  else {
    combined._4_4_ = this_local._4_4_;
  }
  if ((sid.id._2_1_ & 1) == 0) {
    pPVar4 = ::std::begin<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>
                       (__cont);
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)&combined,
               (int)((ulong)((long)pPVar5 - (long)pPVar4) >> 2) * -0x33333333);
  }
  else {
    combined._0_4_ = this_local._0_4_;
  }
  itr = (CombinedImageSamplerParameter *)
        &((this->super_Compiler).current_function)->combined_parameters;
  pCVar7 = ::std::
           begin<spirv_cross::SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,8ul>>
                     ((SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL> *)
                      itr);
  pCVar8 = ::std::
           end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,8ul>>
                     ((SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL> *)
                      itr);
  local_fc = sid.id._3_1_ & 1;
  bStack_fb = sid.id._2_1_ & 1;
  uStack_f8 = combined._4_4_;
  local_f4 = combined._0_4_;
  local_108 = combined._0_4_;
  local_110 = CONCAT44(combined._4_4_,CONCAT22(uStack_fa,CONCAT11(sid.id._2_1_,sid.id._3_1_))) &
              0xffffffffffff0101;
  __pred_00.sid.id = combined._0_4_;
  __pred_00.global_image = (bool)(char)local_110;
  __pred_00.global_sampler = (bool)(char)(local_110 >> 8);
  __pred_00._2_2_ = (short)(local_110 >> 0x10);
  __pred_00.iid.id = (int)(local_110 >> 0x20);
  pCVar7 = ::std::
           find_if<spirv_cross::SPIRFunction::CombinedImageSamplerParameter*,spirv_cross::CompilerGLSL::to_combined_image_sampler[abi:cxx11](spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>)::__2>
                     (pCVar7,pCVar8,__pred_00);
  local_f0 = pCVar7;
  pCVar8 = ::std::
           end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,8ul>>
                     ((SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL> *)
                      itr);
  if (pCVar7 == pCVar8) {
    pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (pCVar9,
               "Cannot find mapping for combined sampler parameter, was build_combined_image_samplers() used before compile() was called?"
              );
    __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)local_f0);
  to_expression_abi_cxx11_(&local_130,this,uVar1,true);
  ::std::operator+(__return_storage_ptr__,&local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&array_index
                  );
  ::std::__cxx11::string::~string((string *)&local_130);
LAB_00487c32:
  mapping._4_4_ = 1;
  ::std::__cxx11::string::~string((string *)&array_index);
  ::std::__cxx11::string::~string((string *)(array_expr.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_combined_image_sampler(VariableID image_id, VariableID samp_id)
{
	// Keep track of the array indices we have used to load the image.
	// We'll need to use the same array index into the combined image sampler array.
	auto image_expr = to_non_uniform_aware_expression(image_id);
	string array_expr;
	auto array_index = image_expr.find_first_of('[');
	if (array_index != string::npos)
		array_expr = image_expr.substr(array_index, string::npos);

	auto &args = current_function->arguments;

	// For GLSL and ESSL targets, we must enumerate all possible combinations for sampler2D(texture2D, sampler) and redirect
	// all possible combinations into new sampler2D uniforms.
	auto *image = maybe_get_backing_variable(image_id);
	auto *samp = maybe_get_backing_variable(samp_id);
	if (image)
		image_id = image->self;
	if (samp)
		samp_id = samp->self;

	auto image_itr = find_if(begin(args), end(args),
	                         [image_id](const SPIRFunction::Parameter &param) { return image_id == param.id; });

	auto sampler_itr = find_if(begin(args), end(args),
	                           [samp_id](const SPIRFunction::Parameter &param) { return samp_id == param.id; });

	if (image_itr != end(args) || sampler_itr != end(args))
	{
		// If any parameter originates from a parameter, we will find it in our argument list.
		bool global_image = image_itr == end(args);
		bool global_sampler = sampler_itr == end(args);
		VariableID iid = global_image ? image_id : VariableID(uint32_t(image_itr - begin(args)));
		VariableID sid = global_sampler ? samp_id : VariableID(uint32_t(sampler_itr - begin(args)));

		auto &combined = current_function->combined_parameters;
		auto itr = find_if(begin(combined), end(combined), [=](const SPIRFunction::CombinedImageSamplerParameter &p) {
			return p.global_image == global_image && p.global_sampler == global_sampler && p.image_id == iid &&
			       p.sampler_id == sid;
		});

		if (itr != end(combined))
			return to_expression(itr->id) + array_expr;
		else
		{
			SPIRV_CROSS_THROW("Cannot find mapping for combined sampler parameter, was "
			                  "build_combined_image_samplers() used "
			                  "before compile() was called?");
		}
	}
	else
	{
		// For global sampler2D, look directly at the global remapping table.
		auto &mapping = combined_image_samplers;
		auto itr = find_if(begin(mapping), end(mapping), [image_id, samp_id](const CombinedImageSampler &combined) {
			return combined.image_id == image_id && combined.sampler_id == samp_id;
		});

		if (itr != end(combined_image_samplers))
			return to_expression(itr->combined_id) + array_expr;
		else
		{
			SPIRV_CROSS_THROW("Cannot find mapping for combined sampler, was build_combined_image_samplers() used "
			                  "before compile() was called?");
		}
	}
}